

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-text.cpp
# Opt level: O0

void ScanLine(int x1,int y1,int x2,int y2,int ymax,vector<int,_std::allocator<int>_> *xrange)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  vector<int,_std::allocator<int>_> *in_R9;
  int cnt;
  int k;
  int n;
  int m;
  int y;
  int x;
  int dy2;
  int dx2;
  int dy1;
  int dx1;
  int sy;
  int sx;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  local_60 = in_EDX - in_EDI;
  local_5c = in_ECX - in_ESI;
  if (local_60 < 1) {
    if (local_60 < 0) {
      local_2c = -1;
    }
    else {
      local_2c = 0;
    }
  }
  else {
    local_2c = 1;
  }
  if (local_5c < 1) {
    if (local_5c < 0) {
      local_30 = -1;
    }
    else {
      local_30 = 0;
    }
  }
  else {
    local_30 = 1;
  }
  local_54 = local_60;
  if (local_60 < 0) {
    local_54 = -local_60;
  }
  local_44 = local_54;
  local_58 = local_5c;
  if (local_5c < 0) {
    local_58 = -local_5c;
  }
  local_48 = local_58;
  local_34 = local_2c;
  local_38 = 0;
  if (local_54 < local_58) {
    if (local_5c < 0) {
      local_5c = -local_5c;
    }
    local_44 = local_5c;
    if (local_60 < 0) {
      local_60 = -local_60;
    }
    local_48 = local_60;
    local_34 = 0;
    local_38 = local_30;
  }
  local_4c = local_48 / 2;
  local_50 = local_44 + 1;
  local_40 = in_ESI;
  local_3c = in_EDI;
  while (local_50 != 0) {
    if ((-1 < local_40) && (local_40 < in_R8D)) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_R9,(long)(local_40 << 1));
      if (local_3c < *pvVar3) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_R9,(long)(local_40 << 1));
        *pvVar3 = local_3c;
      }
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_R9,(long)(local_40 * 2 + 1));
      if (*pvVar3 < local_3c) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_R9,(long)(local_40 * 2 + 1));
        *pvVar3 = local_3c;
      }
    }
    local_4c = local_48 + local_4c;
    iVar1 = local_38;
    iVar2 = local_34;
    if (local_44 <= local_4c) {
      local_4c = local_4c - local_44;
      iVar1 = local_30;
      iVar2 = local_2c;
    }
    local_3c = iVar2 + local_3c;
    local_40 = iVar1 + local_40;
    local_50 = local_50 + -1;
  }
  return;
}

Assistant:

void ScanLine(int x1, int y1, int x2, int y2, int ymax, std::vector<int> & xrange) {
    int sx, sy, dx1, dy1, dx2, dy2, x, y, m, n, k, cnt;

    sx = x2 - x1;
    sy = y2 - y1;

    if (sx > 0) dx1 = 1;
    else if (sx < 0) dx1 = -1;
    else dx1 = 0;

    if (sy > 0) dy1 = 1;
    else if (sy < 0) dy1 = -1;
    else dy1 = 0;

    m = ABS(sx);
    n = ABS(sy);
    dx2 = dx1;
    dy2 = 0;

    if (m < n)
    {
        m = ABS(sy);
        n = ABS(sx);
        dx2 = 0;
        dy2 = dy1;
    }

    x = x1; y = y1;
    cnt = m + 1;
    k = n / 2;

    while (cnt--) {
        if ((y >= 0) && (y < ymax)) {
            if (x < xrange[2*y+0]) xrange[2*y+0] = x;
            if (x > xrange[2*y+1]) xrange[2*y+1] = x;
        }

        k += n;
        if (k < m) {
            x += dx2;
            y += dy2;
        } else {
            k -= m;
            x += dx1;
            y += dy1;
        }
    }
}